

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::resize
          (Geometry<std::allocator<unsigned_long>_> *this,size_t dimension)

{
  unsigned_long *puVar1;
  unsigned_long *puVar2;
  size_t *psVar3;
  ulong local_50;
  ulong local_38;
  size_t j;
  size_t *newStrides;
  size_t *newShapeStrides;
  size_t *newShape;
  size_t dimension_local;
  Geometry<std::allocator<unsigned_long>_> *this_local;
  
  if (dimension != this->dimension_) {
    puVar1 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                       ((new_allocator<unsigned_long> *)this,dimension * 3,(void *)0x0);
    puVar2 = puVar1 + dimension;
    local_38 = 0;
    while( true ) {
      local_50 = dimension;
      if (this->dimension_ <= dimension) {
        local_50 = this->dimension_;
      }
      if (local_50 <= local_38) break;
      psVar3 = shape(this,local_38);
      puVar1[local_38] = *psVar3;
      psVar3 = shapeStrides(this,local_38);
      puVar2[local_38] = *psVar3;
      psVar3 = strides(this,local_38);
      (puVar2 + dimension)[local_38] = *psVar3;
      local_38 = local_38 + 1;
    }
    __gnu_cxx::new_allocator<unsigned_long>::deallocate
              ((new_allocator<unsigned_long> *)this,this->shape_,this->dimension_ * 3);
    this->shape_ = puVar1;
    this->shapeStrides_ = puVar2;
    this->strides_ = puVar2 + dimension;
    this->dimension_ = dimension;
  }
  return;
}

Assistant:

inline void 
Geometry<A>::resize
(
    const std::size_t dimension
)
{
    if(dimension != dimension_) {
        std::size_t* newShape = allocator_.allocate(dimension*3);
        std::size_t* newShapeStrides = newShape + dimension;
        std::size_t* newStrides = newShapeStrides + dimension; 
        for(std::size_t j=0; j<( (dimension < dimension_) ? dimension : dimension_); ++j) {
            // save existing entries
            newShape[j] = shape(j);
            newShapeStrides[j] = shapeStrides(j);
            newStrides[j] = strides(j);
        }
        allocator_.deallocate(shape_, dimension_*3);
        shape_ = newShape;
        shapeStrides_ = newShapeStrides;
        strides_ = newStrides;
        dimension_ = dimension;
    }
}